

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O0

SnapArrayInfoBlock<double> *
TTD::NSSnapObjects::AllocateArrayInfoBlock<double,false>
          (SlabAllocator *alloc,uint32 firstIndex,uint32 lastIndex)

{
  SnapArrayInfoBlock<double> *pSVar1;
  double *pdVar2;
  uchar *puVar3;
  SnapArrayInfoBlock<double> *sai;
  uint32 lastIndex_local;
  uint32 firstIndex_local;
  SlabAllocator *alloc_local;
  
  pSVar1 = SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapArrayInfoBlock<double>>
                     (alloc);
  pSVar1->FirstIndex = firstIndex;
  pSVar1->LastIndex = lastIndex;
  pdVar2 = SlabAllocatorBase<0>::SlabAllocateArray<double>(alloc,(ulong)(lastIndex - firstIndex));
  pSVar1->ArrayRangeContents = pdVar2;
  puVar3 = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_char>
                     (alloc,(ulong)(lastIndex - firstIndex));
  pSVar1->ArrayValidTags = puVar3;
  pSVar1->Next = (SnapArrayInfoBlock<double> *)0x0;
  return pSVar1;
}

Assistant:

SnapArrayInfoBlock<T>* AllocateArrayInfoBlock(SlabAllocator& alloc, uint32 firstIndex, uint32 lastIndex)
        {
            SnapArrayInfoBlock<T>* sai = alloc.SlabAllocateStruct< SnapArrayInfoBlock<T> >();
            sai->FirstIndex = firstIndex;
            sai->LastIndex = lastIndex;

            sai->ArrayRangeContents = alloc.SlabAllocateArray<T>(lastIndex - firstIndex);
            sai->ArrayValidTags = alloc.SlabAllocateArray<byte>(lastIndex - firstIndex);

            //only zero valid flags (which guard the contents values)
            if(zeroFillValid)
            {
                memset(sai->ArrayValidTags, 0, lastIndex - firstIndex);
            }

            sai->Next = nullptr;

            return sai;
        }